

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuilderTask.cpp
# Opt level: O2

void __thiscall
nigel::BuilderTask::BuilderTask
          (BuilderTask *this,String *name,String *description,String *helpText,
          list<std::shared_ptr<nigel::BuilderExecutable>,_std::allocator<std::shared_ptr<nigel::BuilderExecutable>_>_>
          *executables)

{
  list<std::shared_ptr<nigel::BuilderExecutable>,_std::allocator<std::shared_ptr<nigel::BuilderExecutable>_>_>
  *this_00;
  map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_01;
  _Rb_tree_header *p_Var1;
  mapped_type *pmVar2;
  key_type local_44;
  String *local_40;
  string *local_38;
  
  this->_vptr_BuilderTask = (_func_int **)&PTR__BuilderTask_0019a238;
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  local_40 = &this->name;
  (this->name).field_2._M_local_buf[0] = '\0';
  (this->description)._M_dataplus._M_p = (pointer)&(this->description).field_2;
  (this->description)._M_string_length = 0;
  local_38 = (string *)&this->description;
  (this->description).field_2._M_local_buf[0] = '\0';
  (this->helpText)._M_dataplus._M_p = (pointer)&(this->helpText).field_2;
  (this->helpText)._M_string_length = 0;
  (this->helpText).field_2._M_local_buf[0] = '\0';
  this_00 = &this->executables;
  (this->executables).
  super__List_base<std::shared_ptr<nigel::BuilderExecutable>,_std::allocator<std::shared_ptr<nigel::BuilderExecutable>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)this_00;
  (this->executables).
  super__List_base<std::shared_ptr<nigel::BuilderExecutable>,_std::allocator<std::shared_ptr<nigel::BuilderExecutable>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)this_00;
  (this->executables).
  super__List_base<std::shared_ptr<nigel::BuilderExecutable>,_std::allocator<std::shared_ptr<nigel::BuilderExecutable>_>_>
  ._M_impl._M_node._M_size = 0;
  this_01 = &this->notificationTexts;
  p_Var1 = &(this->notificationTexts)._M_t._M_impl.super__Rb_tree_header;
  (this->notificationTexts)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->notificationTexts)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->notificationTexts)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->notificationTexts)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->notificationTexts)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::__cxx11::string::_M_assign((string *)local_40);
  std::__cxx11::string::_M_assign(local_38);
  std::__cxx11::string::_M_assign((string *)&this->helpText);
  std::__cxx11::
  list<std::shared_ptr<nigel::BuilderExecutable>,_std::allocator<std::shared_ptr<nigel::BuilderExecutable>_>_>
  ::operator=(this_00,executables);
  local_44 = err_unclosedIfdef;
  pmVar2 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_01,&local_44);
  std::__cxx11::string::assign((char *)pmVar2);
  local_44 = err_elseifWithoutIfdef;
  pmVar2 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_01,&local_44);
  std::__cxx11::string::assign((char *)pmVar2);
  local_44 = err_endifWithoutIfdef;
  pmVar2 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_01,&local_44);
  std::__cxx11::string::assign((char *)pmVar2);
  local_44 = err_incompleteDefineDirective;
  pmVar2 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_01,&local_44);
  std::__cxx11::string::assign((char *)pmVar2);
  local_44 = err_incompleteUndefineDirective;
  pmVar2 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_01,&local_44);
  std::__cxx11::string::assign((char *)pmVar2);
  local_44 = err_incompleteIfdefDirective;
  pmVar2 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_01,&local_44);
  std::__cxx11::string::assign((char *)pmVar2);
  local_44 = err_incompleteIfndefDirective;
  pmVar2 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_01,&local_44);
  std::__cxx11::string::assign((char *)pmVar2);
  local_44 = err_incompleteIncludeDirective;
  pmVar2 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_01,&local_44);
  std::__cxx11::string::assign((char *)pmVar2);
  local_44 = err_incompletePragma;
  pmVar2 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_01,&local_44);
  std::__cxx11::string::assign((char *)pmVar2);
  local_44 = err_incompleteMemModelPragma;
  pmVar2 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_01,&local_44);
  std::__cxx11::string::assign((char *)pmVar2);
  local_44 = err_unknownMemModelPragma;
  pmVar2 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_01,&local_44);
  std::__cxx11::string::assign((char *)pmVar2);
  local_44 = err_unknownPragma;
  pmVar2 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_01,&local_44);
  std::__cxx11::string::assign((char *)pmVar2);
  local_44 = err_unknownDirective;
  pmVar2 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_01,&local_44);
  std::__cxx11::string::assign((char *)pmVar2);
  local_44 = err_errorDirective;
  pmVar2 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_01,&local_44);
  std::__cxx11::string::assign((char *)pmVar2);
  local_44 = err_reachedEOF_unfinishedExpression;
  pmVar2 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_01,&local_44);
  std::__cxx11::string::assign((char *)pmVar2);
  local_44 = err_unexpectedToken;
  pmVar2 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_01,&local_44);
  std::__cxx11::string::assign((char *)pmVar2);
  local_44 = err_expectedIdentifier_atAllocation;
  pmVar2 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_01,&local_44);
  std::__cxx11::string::assign((char *)pmVar2);
  local_44 = err_expectedExprWithReturnValue_atAllocation;
  pmVar2 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_01,&local_44);
  std::__cxx11::string::assign((char *)pmVar2);
  local_44 = err_expectedEqlSign_atAllocation;
  pmVar2 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_01,&local_44);
  std::__cxx11::string::assign((char *)pmVar2);
  local_44 = err_expectedKnownLiteral;
  pmVar2 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_01,&local_44);
  std::__cxx11::string::assign((char *)pmVar2);
  local_44 = err_variableAlreadyDefined;
  pmVar2 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_01,&local_44);
  std::__cxx11::string::assign((char *)pmVar2);
  local_44 = err_undefinedIdentifier;
  pmVar2 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_01,&local_44);
  std::__cxx11::string::assign((char *)pmVar2);
  local_44 = err_noAllocationAfterVariableAttribute;
  pmVar2 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_01,&local_44);
  std::__cxx11::string::assign((char *)pmVar2);
  local_44 = err_unexpectedReturningBeforeByteKeyword;
  pmVar2 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_01,&local_44);
  std::__cxx11::string::assign((char *)pmVar2);
  local_44 = err_unexpectedReturningBeforeFastKeyword;
  pmVar2 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_01,&local_44);
  std::__cxx11::string::assign((char *)pmVar2);
  local_44 = err_unexpectedReturningBeforeNormKeyword;
  pmVar2 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_01,&local_44);
  std::__cxx11::string::assign((char *)pmVar2);
  local_44 = err_unexpectedReturningBeforeUnsignedKeyword;
  pmVar2 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_01,&local_44);
  std::__cxx11::string::assign((char *)pmVar2);
  local_44 = err_unexpectedReturningBeforeIdentifier;
  pmVar2 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_01,&local_44);
  std::__cxx11::string::assign((char *)pmVar2);
  local_44 = err_unexpectedReturningBeforeLiteral;
  pmVar2 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_01,&local_44);
  std::__cxx11::string::assign((char *)pmVar2);
  local_44 = err_unexpectedReturningBeforeParenthesisBlock;
  pmVar2 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_01,&local_44);
  std::__cxx11::string::assign((char *)pmVar2);
  local_44 = err_unexpectedReturningBeforeBlock;
  pmVar2 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_01,&local_44);
  std::__cxx11::string::assign((char *)pmVar2);
  local_44 = err_unexpectedReturningBeforeFunctionDeklaration;
  pmVar2 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_01,&local_44);
  std::__cxx11::string::assign((char *)pmVar2);
  local_44 = err_expectedIdentifierBeforeOperator;
  pmVar2 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_01,&local_44);
  std::__cxx11::string::assign((char *)pmVar2);
  local_44 = err_expectedIdentifierAfterOperator;
  pmVar2 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_01,&local_44);
  std::__cxx11::string::assign((char *)pmVar2);
  local_44 = err_expectedExprWithReturnValue_atOperation;
  pmVar2 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_01,&local_44);
  std::__cxx11::string::assign((char *)pmVar2);
  local_44 = err_unmatchingTypeFound_atTerm;
  pmVar2 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_01,&local_44);
  std::__cxx11::string::assign((char *)pmVar2);
  local_44 = err_unknownBinaryOperator;
  pmVar2 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_01,&local_44);
  std::__cxx11::string::assign((char *)pmVar2);
  local_44 = err_unknownUnaryOperator;
  pmVar2 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_01,&local_44);
  std::__cxx11::string::assign((char *)pmVar2);
  local_44 = err_cannotSetAConstantLiteral;
  pmVar2 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_01,&local_44);
  std::__cxx11::string::assign((char *)pmVar2);
  local_44 = err_onlyConstantsAreAllowedForBitShifts;
  pmVar2 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_01,&local_44);
  std::__cxx11::string::assign((char *)pmVar2);
  local_44 = err_onlyPositiveConstantsAreAllowedForBitShifts;
  pmVar2 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_01,&local_44);
  std::__cxx11::string::assign((char *)pmVar2);
  local_44 = err_cannotSetAConstantLiteralInCombinedOperationSet;
  pmVar2 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_01,&local_44);
  std::__cxx11::string::assign((char *)pmVar2);
  local_44 = err_expectedIdentifierInParenthesis;
  pmVar2 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_01,&local_44);
  std::__cxx11::string::assign((char *)pmVar2);
  local_44 = err_expectedExprWithReturnValue_atParenthesis;
  pmVar2 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_01,&local_44);
  std::__cxx11::string::assign((char *)pmVar2);
  local_44 = err_unexpectedLiteralInParenthesis;
  pmVar2 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_01,&local_44);
  std::__cxx11::string::assign((char *)pmVar2);
  local_44 = err_unexpectedIdentifierInParenthesis;
  pmVar2 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_01,&local_44);
  std::__cxx11::string::assign((char *)pmVar2);
  local_44 = err_expectedTermAfterReturnableInParenthesis;
  pmVar2 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_01,&local_44);
  std::__cxx11::string::assign((char *)pmVar2);
  local_44 = err_unexpectedCloseOfParenthesis;
  pmVar2 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_01,&local_44);
  std::__cxx11::string::assign((char *)pmVar2);
  local_44 = err_aParenthesisWasNotClosed;
  pmVar2 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_01,&local_44);
  std::__cxx11::string::assign((char *)pmVar2);
  local_44 = err_unexpectedCloseOfBlock;
  pmVar2 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_01,&local_44);
  std::__cxx11::string::assign((char *)pmVar2);
  local_44 = err_aBlockWasNotClosed;
  pmVar2 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_01,&local_44);
  std::__cxx11::string::assign((char *)pmVar2);
  local_44 = err_expectParenthesisAfterIfKeyword;
  pmVar2 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_01,&local_44);
  std::__cxx11::string::assign((char *)pmVar2);
  local_44 = err_expectBlockAfterIf;
  pmVar2 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_01,&local_44);
  std::__cxx11::string::assign((char *)pmVar2);
  local_44 = err_expectBlockAfterElse;
  pmVar2 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_01,&local_44);
  std::__cxx11::string::assign((char *)pmVar2);
  local_44 = err_expectedExprWithConditionalValue_atOperation;
  pmVar2 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_01,&local_44);
  std::__cxx11::string::assign((char *)pmVar2);
  local_44 = err_expectParenthesisAfterWhileKeyword;
  pmVar2 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_01,&local_44);
  std::__cxx11::string::assign((char *)pmVar2);
  local_44 = err_expectBlockAfterWhile;
  pmVar2 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_01,&local_44);
  std::__cxx11::string::assign((char *)pmVar2);
  local_44 = err_comparisonConditionCannotBeThisRValue;
  pmVar2 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_01,&local_44);
  std::__cxx11::string::assign((char *)pmVar2);
  local_44 = err_unexpectedIdentifierBeforeNotOperator;
  pmVar2 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_01,&local_44);
  std::__cxx11::string::assign((char *)pmVar2);
  local_44 = err_operationsAreNotAllowedInGlobalScope;
  pmVar2 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_01,&local_44);
  std::__cxx11::string::assign((char *)pmVar2);
  local_44 = err_functionDefinitionsAreNotAllowedInLocalScope;
  pmVar2 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_01,&local_44);
  std::__cxx11::string::assign((char *)pmVar2);
  local_44 = err_unknownTypeAtFunction;
  pmVar2 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_01,&local_44);
  std::__cxx11::string::assign((char *)pmVar2);
  local_44 = err_expectedIdentifier_atFunction;
  pmVar2 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_01,&local_44);
  std::__cxx11::string::assign((char *)pmVar2);
  local_44 = err_expectedOpeningParenthesis_atFunction;
  pmVar2 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_01,&local_44);
  std::__cxx11::string::assign((char *)pmVar2);
  local_44 = err_unknownTypeAtFunctionParameter;
  pmVar2 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_01,&local_44);
  std::__cxx11::string::assign((char *)pmVar2);
  local_44 = err_unknownTokenAfterFunctionParameter;
  pmVar2 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_01,&local_44);
  std::__cxx11::string::assign((char *)pmVar2);
  local_44 = err_expectedBlockAfterFunctionHead;
  pmVar2 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_01,&local_44);
  std::__cxx11::string::assign((char *)pmVar2);
  local_44 = err_functionIdentifierAlreadyAssigned;
  pmVar2 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_01,&local_44);
  std::__cxx11::string::assign((char *)pmVar2);
  local_44 = err_expectedReturningExpression_atFunctionCall;
  pmVar2 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_01,&local_44);
  std::__cxx11::string::assign((char *)pmVar2);
  local_44 = err_expectedOpeningParenthesis_atFunctionCall;
  pmVar2 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_01,&local_44);
  std::__cxx11::string::assign((char *)pmVar2);
  local_44 = err_unknownTypeAtFunctionCallParameter;
  pmVar2 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_01,&local_44);
  std::__cxx11::string::assign((char *)pmVar2);
  local_44 = err_expectedReturningExpression_AtReturn;
  pmVar2 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_01,&local_44);
  std::__cxx11::string::assign((char *)pmVar2);
  local_44 = err_returnHasToBeInTheOuterScope;
  pmVar2 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_01,&local_44);
  std::__cxx11::string::assign((char *)pmVar2);
  local_44 = err_notFoundMatchingFunctionDeclaration;
  pmVar2 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_01,&local_44);
  std::__cxx11::string::assign((char *)pmVar2);
  local_44 = err_expectedVariableForReference;
  pmVar2 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_01,&local_44);
  std::__cxx11::string::assign((char *)pmVar2);
  local_44 = err_expectedVariableForDeferencing;
  pmVar2 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_01,&local_44);
  std::__cxx11::string::assign((char *)pmVar2);
  local_44 = err_cannotGetRefOfLargeGlobal;
  pmVar2 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_01,&local_44);
  std::__cxx11::string::assign((char *)pmVar2);
  local_44 = err_unknownASTExpr;
  pmVar2 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_01,&local_44);
  std::__cxx11::string::assign((char *)pmVar2);
  local_44 = err_cannotBreakAtThisPosition;
  pmVar2 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_01,&local_44);
  std::__cxx11::string::assign((char *)pmVar2);
  local_44 = err_internal_blockNotFound;
  pmVar2 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_01,&local_44);
  std::__cxx11::string::assign((char *)pmVar2);
  local_44 = err_internal_conditionalNotFound;
  pmVar2 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_01,&local_44);
  std::__cxx11::string::assign((char *)pmVar2);
  local_44 = err_functionDefinitionNotFound;
  pmVar2 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_01,&local_44);
  std::__cxx11::string::assign((char *)pmVar2);
  local_44 = err_mainEntryPointNotFound;
  pmVar2 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_01,&local_44);
  std::__cxx11::string::assign((char *)pmVar2);
  local_44 = err_symbolIsAlreadyDefined;
  pmVar2 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_01,&local_44);
  std::__cxx11::string::assign((char *)pmVar2);
  local_44 = warn_warningDirective;
  pmVar2 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_01,&local_44);
  std::__cxx11::string::assign((char *)pmVar2);
  local_44 = warn_emptyDirective;
  pmVar2 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_01,&local_44);
  std::__cxx11::string::assign((char *)pmVar2);
  local_44 = warn_undefinedIdentifiernAtUndefDirective;
  pmVar2 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_01,&local_44);
  std::__cxx11::string::assign((char *)pmVar2);
  local_44 = warn_toManyVariablesInFastRAM;
  pmVar2 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_01,&local_44);
  std::__cxx11::string::assign((char *)pmVar2);
  local_44 = imp_operationOnTwoConstantsCanBePrevented;
  pmVar2 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_01,&local_44);
  std::__cxx11::string::assign((char *)pmVar2);
  local_44 = imp_operationOnConstantCanBePrevented;
  pmVar2 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_01,&local_44);
  std::__cxx11::string::assign((char *)pmVar2);
  return;
}

Assistant:

BuilderTask::BuilderTask( String name, String description, String helpText, std::list<std::shared_ptr<BuilderExecutable>> executables )
	{
		this->name = name;
		this->description = description;
		this->helpText = helpText;
		this->executables = executables;

		//Load notification texts
		notificationTexts[NT::err_unclosedIfdef] = "An ifdef or ifndef is never closed.";
		notificationTexts[NT::err_elseifWithoutIfdef] = "Found elseif without prior ifdef/ifndef.";
		notificationTexts[NT::err_endifWithoutIfdef] = "Found endif without prior ifdef/ifndef.";
		notificationTexts[NT::err_incompleteDefineDirective] = "Incomplete define-directive found. Use '#define <identifier> [definition]'.";
		notificationTexts[NT::err_incompleteUndefineDirective] = "Incomplete undef-directive found. Use '#undef <identifier>'.";
		notificationTexts[NT::err_incompleteIfdefDirective] = "Incomplete ifdef-directive found. Use '#ifdef <identifier>'.";
		notificationTexts[NT::err_incompleteIfndefDirective] = "Incomplete ifndef-directive found. Use '#ifndef <identifier>'.";
		notificationTexts[NT::err_incompleteIncludeDirective] = "Incomplete include-directive found. Use '#include \"<path_to_file>\"'.";
		notificationTexts[NT::err_incompletePragma] = "Incomplete pragma-directive found. Use '#pragma <command> [parameter [...]]'.";
		notificationTexts[NT::err_incompleteMemModelPragma] = "Incomplete memmodel pragma-directive found. Use '#pragma memmodel <model>'.";
		notificationTexts[NT::err_unknownMemModelPragma] = "Unknown memory model defined in pragma. Use fast or large";
		notificationTexts[NT::err_unknownPragma] = "Unknown pragma found.";
		notificationTexts[NT::err_unknownDirective] = "Unknown preprocessor directive found.";
		notificationTexts[NT::err_errorDirective] = "error directive";

		notificationTexts[NT::err_reachedEOF_unfinishedExpression] = "Reached end of file with unfinished expression.";
		notificationTexts[NT::err_unexpectedToken] = "Unexpectd token found. What did you tend to achive with this token?";
		notificationTexts[NT::err_expectedIdentifier_atAllocation] = "An identifier was expected.";
		notificationTexts[NT::err_expectedExprWithReturnValue_atAllocation] = "Expected expression or value at a variable allocation.";
		notificationTexts[NT::err_expectedEqlSign_atAllocation] = "Expected '=' at allocation.";
		notificationTexts[NT::err_expectedKnownLiteral] = "Expected known literal.";
		notificationTexts[NT::err_variableAlreadyDefined] = "The variable identifier is already defined.";
		notificationTexts[NT::err_undefinedIdentifier] = "This identifier is not defined.";
		notificationTexts[NT::err_noAllocationAfterVariableAttribute] = "Expected allocation after attribute keyword.";

		notificationTexts[NT::err_unexpectedReturningBeforeByteKeyword] = "Unexpected returnable before byte keyword.";
		notificationTexts[NT::err_unexpectedReturningBeforeFastKeyword] = "Unexpected returnable before fast keyword.";
		notificationTexts[NT::err_unexpectedReturningBeforeNormKeyword] = "Unexpected returnable before norm keyword.";
		notificationTexts[NT::err_unexpectedReturningBeforeUnsignedKeyword] = "Unexpected returnable before unsigned keyword.";
		notificationTexts[NT::err_unexpectedReturningBeforeIdentifier] = "Unexpected returnable before identifier.";
		notificationTexts[NT::err_unexpectedReturningBeforeLiteral] = "Unexpected returnable before literal.";
		notificationTexts[NT::err_unexpectedReturningBeforeParenthesisBlock] = "Unexpected returnable before parenthesis block.";
		notificationTexts[NT::err_unexpectedReturningBeforeBlock] = "Unexpected returnable before block.";
		notificationTexts[NT::err_unexpectedReturningBeforeFunctionDeklaration] = "Unexpected returnable before function.";
		notificationTexts[NT::err_expectedIdentifierBeforeOperator] = "Exptected Identifiern before operation.";
		notificationTexts[NT::err_expectedIdentifierAfterOperator] = "Exptected Identifiern after operation.";
		notificationTexts[NT::err_expectedExprWithReturnValue_atOperation] = "Expected expression or value as rValue at operation.";
		notificationTexts[NT::err_unmatchingTypeFound_atTerm] = "Found unmatching type at Operation.";
		notificationTexts[NT::err_unknownBinaryOperator] = "Unknown binary operator.";
		notificationTexts[NT::err_unknownUnaryOperator] = "Unknown unary operator.";

		notificationTexts[NT::err_cannotSetAConstantLiteral] = "Cannot set a constant literal or term. Did you mean '=='?";
		notificationTexts[NT::err_onlyConstantsAreAllowedForBitShifts] = "Only positive constants are allowed for binary shifts, due to processor limitations.";
		notificationTexts[NT::err_onlyPositiveConstantsAreAllowedForBitShifts] = "Only positive constants are allowed for binary shifts. Use the opperation antagonist instead.";
		notificationTexts[NT::err_cannotSetAConstantLiteralInCombinedOperationSet] = "Cannot set a constant literal or term with the operation result.";


		notificationTexts[NT::err_expectedIdentifierInParenthesis] = "Unexpected identifier in parenthesis block.";
		notificationTexts[NT::err_expectedExprWithReturnValue_atParenthesis] = "Expected returnable in parenthesis block.";
		notificationTexts[NT::err_unexpectedLiteralInParenthesis] = "Unexpected literal in parenthesis block.";
		notificationTexts[NT::err_unexpectedIdentifierInParenthesis] = "Unexpected identifier in parenthesis block.";
		notificationTexts[NT::err_expectedTermAfterReturnableInParenthesis] = "Expected term after returnable in parenthesis block.";
		notificationTexts[NT::err_unexpectedCloseOfParenthesis] = "Unexpected closing of parenthesis block.";
		notificationTexts[NT::err_aParenthesisWasNotClosed] = "A parenthesis block was not closed.";

		notificationTexts[NT::err_unexpectedCloseOfBlock] = "Unexpected closing of block.";
		notificationTexts[NT::err_aBlockWasNotClosed] = "A block was not closed.";

		notificationTexts[NT::err_expectParenthesisAfterIfKeyword] = "Expect parenthesis after if keyword.";
		notificationTexts[NT::err_expectBlockAfterIf] = "Expect block after if statement.";
		notificationTexts[NT::err_expectBlockAfterElse] = "Expect block after else statement.";

		notificationTexts[NT::err_expectedExprWithConditionalValue_atOperation] = "Expected boolean expression or value as rValue at operation.";

		notificationTexts[NT::err_expectParenthesisAfterWhileKeyword] = "Expect parenthesis after while statement.";
		notificationTexts[NT::err_expectBlockAfterWhile] = "Expect block after while statement.";
		notificationTexts[NT::err_comparisonConditionCannotBeThisRValue] = "A comparison condition cannot be the rValue of this expressions.";
		notificationTexts[NT::err_unexpectedIdentifierBeforeNotOperator] = "Unexpected identifier before 'not' operator.";

		notificationTexts[NT::err_operationsAreNotAllowedInGlobalScope] = "Operations can't be done in the global scope.";
		notificationTexts[NT::err_functionDefinitionsAreNotAllowedInLocalScope] = "Functions can't be defined in the local scope.";

		notificationTexts[NT::err_unknownTypeAtFunction] = "Unknown type at function deklaration.";
		notificationTexts[NT::err_expectedIdentifier_atFunction] = "Expected identifier at function deklaration.";
		notificationTexts[NT::err_expectedOpeningParenthesis_atFunction] = "Expected opening parenthesis at function deklaration.";
		notificationTexts[NT::err_unknownTypeAtFunctionParameter] = "Unknown type at function parameter.";
		notificationTexts[NT::err_unknownTokenAfterFunctionParameter] = "Unknown token after function parameter.";
		notificationTexts[NT::err_expectedBlockAfterFunctionHead] = "Expected block after function head.";
		notificationTexts[NT::err_functionIdentifierAlreadyAssigned] = "This identifier was already assigned.";
		notificationTexts[NT::err_expectedReturningExpression_atFunctionCall] = "Expected retunable at function call.";
		notificationTexts[NT::err_expectedOpeningParenthesis_atFunctionCall] = "Expected opening parenthesis at function call.";
		notificationTexts[NT::err_unknownTypeAtFunctionCallParameter] = "Unknown type at function call parameter.";
		notificationTexts[NT::err_expectedReturningExpression_AtReturn] = "Expected retunable at return statement.";
		notificationTexts[NT::err_returnHasToBeInTheOuterScope] = "The return statement has to be in the outer scope of a function.";
		notificationTexts[NT::err_notFoundMatchingFunctionDeclaration] = "Did not found a matching function for this call. The parameter types do not match.";

		notificationTexts[NT::err_expectedVariableForReference] = "Expected variable to refer to.";
		notificationTexts[NT::err_expectedVariableForDeferencing] = "Expected pointer to dereference.";
		notificationTexts[NT::err_cannotGetRefOfLargeGlobal] = "Can't get the address of a large global. User the attribute 'fast' in the variable declaration.";

		notificationTexts[NT::err_unknownASTExpr] = "Unknown expression found.";
		notificationTexts[NT::err_cannotBreakAtThisPosition] = "Can't break out of this or outer scope.";

		notificationTexts[NT::err_internal_blockNotFound] = "Internal error: block was not found.";
		notificationTexts[NT::err_internal_conditionalNotFound] = "Internal error: condition was not found.";
		notificationTexts[NT::err_functionDefinitionNotFound] = "Function definition was not found.";
		notificationTexts[NT::err_mainEntryPointNotFound] = "Main entry point not found! Please define the main function.";
		notificationTexts[NT::err_symbolIsAlreadyDefined] = "This symbol is already defined.";


		notificationTexts[NT::warn_warningDirective] = "waring directive.";
		notificationTexts[NT::warn_emptyDirective] = "Preprocessor directive is empty. You can safely remove this line.";
		notificationTexts[NT::warn_undefinedIdentifiernAtUndefDirective] = "Undef directive used for undefined identifier.";

		notificationTexts[NT::warn_toManyVariablesInFastRAM] = "To many variables were declared for fast memory. All other variables will be saved in normal memory.";


		notificationTexts[NT::imp_operationOnTwoConstantsCanBePrevented] = "The operation is obsolete and could be replaced by a single constant.";
		notificationTexts[NT::imp_operationOnConstantCanBePrevented] = "The operation is obsolete and could be replaced by a single constant.";

	}